

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall
embree::SceneGraph::QuadMeshNode::calculateStatistics(QuadMeshNode *this,Statistics *stat)

{
  MaterialNode *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  
  sVar3 = (this->super_Node).indegree;
  (this->super_Node).indegree = sVar3 + 1;
  if (sVar3 != 0) {
    return;
  }
  stat->numQuadMeshes = stat->numQuadMeshes + 1;
  iVar2 = (*(this->super_Node).super_RefCount._vptr_RefCount[0xe])();
  stat->numQuads = stat->numQuads + CONCAT44(extraout_var,iVar2);
  sVar3 = numBytes(this);
  stat->numQuadBytes = stat->numQuadBytes + sVar3;
  pMVar1 = (this->material).ptr;
  (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[9])(pMVar1,stat);
  return;
}

Assistant:

void SceneGraph::QuadMeshNode::calculateStatistics(Statistics& stat)
  {
    indegree++;
    if (indegree == 1) {
      stat.numQuadMeshes++;
      stat.numQuads += numPrimitives();
      stat.numQuadBytes += numBytes();
      material->calculateStatistics(stat);
    }
  }